

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void open_do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_String filename;
  Am_String default_file_name;
  Am_String AStack_38;
  Am_String local_30;
  Am_Object local_28;
  Am_String local_20;
  Am_Object local_18;
  
  get_default_filename(&local_18);
  Am_String::Am_String(&local_20,(Am_String *)&local_18);
  Am_Show_File_Dialog_For_Open(&AStack_38);
  Am_String::~Am_String(&local_20);
  bVar1 = Am_String::Valid(&AStack_38);
  if (bVar1) {
    bVar1 = Am_String::operator==(&AStack_38,"");
    if (!bVar1) {
      Am_Object::Am_Object(&local_28,command_obj);
      Am_String::Am_String(&local_30,&AStack_38);
      Am_Standard_Open_From_Filename(&local_28,&local_30);
      Am_String::~Am_String(&local_30);
      Am_Object::~Am_Object(&local_28);
    }
  }
  Am_String::~Am_String(&AStack_38);
  Am_String::~Am_String((Am_String *)&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, open_do, (Am_Object command_obj))
{
  Am_String default_file_name = get_default_filename(command_obj);
  Am_String filename = Am_Show_File_Dialog_For_Open(default_file_name);
  if (!filename.Valid() || filename == "")
    return;
  Am_Standard_Open_From_Filename(command_obj, filename);
}